

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int tcptran_dialer_getopt(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int local_3c;
  int rv;
  tcptran_ep *ep;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  local_3c = nni_stream_dialer_get(*(nng_stream_dialer **)((long)arg + 0x410),name,buf,szp,t);
  if (local_3c == 9) {
    local_3c = nni_getopt(tcptran_ep_opts,name,arg,buf,szp,t);
  }
  return local_3c;
}

Assistant:

static int
tcptran_dialer_getopt(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	tcptran_ep *ep = arg;
	int         rv;

	rv = nni_stream_dialer_get(ep->dialer, name, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(tcptran_ep_opts, name, ep, buf, szp, t);
	}
	return (rv);
}